

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collator.cpp
# Opt level: O2

Collator * __thiscall
booster::locale::impl_icu::collate_impl<wchar_t>::get_collator
          (collate_impl<wchar_t> *this,level_type ilevel)

{
  long *plVar1;
  level_type lVar2;
  int iVar3;
  undefined4 extraout_var;
  Collator *pCVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  char *__rhs;
  thread_specific_ptr<icu_70::Collator> *this_01;
  ulong uVar5;
  allocator local_6d;
  UErrorCode status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  lVar2 = identical;
  if (ilevel < identical) {
    lVar2 = ilevel;
  }
  uVar5 = 0;
  if (-1 < (int)ilevel) {
    uVar5 = (ulong)lVar2;
  }
  iVar3 = (*((this->collates_[uVar5].key_.p_)->super_refcounted)._vptr_refcounted[2])();
  pCVar4 = *(Collator **)(CONCAT44(extraout_var,iVar3) + 8);
  if (pCVar4 == (Collator *)0x0) {
    this_01 = this->collates_ + uVar5;
    status = U_ZERO_ERROR;
    pCVar4 = (Collator *)icu_70::Collator::createInstance(&this->locale_,&status);
    thread_specific_ptr<icu_70::Collator>::reset(this_01,pCVar4);
    if (U_ZERO_ERROR < status) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_68,"Creation of collate failed:",&local_6d);
      __rhs = (char *)u_errorName_70(status);
      std::operator+(&local_48,&local_68,__rhs);
      runtime_error::runtime_error(this_00,&local_48);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    iVar3 = (*(((this_01->key_).p_)->super_refcounted)._vptr_refcounted[2])();
    plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar3) + 8);
    (**(code **)(*plVar1 + 0x98))(plVar1,get_collator::levels[uVar5]);
    iVar3 = (*(((this_01->key_).p_)->super_refcounted)._vptr_refcounted[2])();
    pCVar4 = *(Collator **)(CONCAT44(extraout_var_01,iVar3) + 8);
  }
  return pCVar4;
}

Assistant:

icu::Collator *get_collator(level_type ilevel) const
                {
                    int l = limit(ilevel);
                    static const icu::Collator::ECollationStrength levels[level_count] = 
                    { 
                        icu::Collator::PRIMARY,
                        icu::Collator::SECONDARY,
                        icu::Collator::TERTIARY,
                        icu::Collator::QUATERNARY,
                        icu::Collator::IDENTICAL
                    };
                    
                    icu::Collator *col = collates_[l].get();
                    if(col)
                        return col;

                    UErrorCode status=U_ZERO_ERROR;

                    collates_[l].reset(icu::Collator::createInstance(locale_,status));

                    if(U_FAILURE(status))
                        throw booster::runtime_error(std::string("Creation of collate failed:") + u_errorName(status));

                    collates_[l]->setStrength(levels[l]);
                    return collates_[l].get();
                }